

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O3

int64_t __thiscall
aeron::archive::AeronArchive::extendRecording
          (AeronArchive *this,int64_t recordingId,string *channel,int32_t streamId,
          Value sourceLocation)

{
  int64_t iVar1;
  Value local_60;
  int32_t local_5c;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  int64_t local_38;
  
  local_58._8_8_ = 0;
  local_60 = sourceLocation;
  local_5c = streamId;
  local_38 = recordingId;
  local_58._M_unused._M_object = operator_new(0x28);
  *(AeronArchive **)local_58._M_unused._0_8_ = this;
  *(string **)((long)local_58._M_unused._0_8_ + 8) = channel;
  *(int32_t **)((long)local_58._M_unused._0_8_ + 0x10) = &local_5c;
  *(Value **)((long)local_58._M_unused._0_8_ + 0x18) = &local_60;
  *(int64_t **)((long)local_58._M_unused._0_8_ + 0x20) = &local_38;
  local_40 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:165:9)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:165:9)>
             ::_M_manager;
  iVar1 = callAndPollForResponse(this,(function<bool_(long)> *)&local_58,"extend recording");
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return iVar1;
}

Assistant:

std::int64_t AeronArchive::extendRecording(std::int64_t recordingId, const std::string& channel, std::int32_t streamId,
                                           codecs::SourceLocation::Value sourceLocation) {
    return callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return archiveProxy_->extendRecording(channel, streamId, sourceLocation, recordingId, correlationId,
                                                  controlSessionId_);
        },
        "extend recording");
}